

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_buffer.c
# Opt level: O2

int lj_cf_buffer_method_commit(lua_State *L)

{
  uint uVar1;
  SBufExt *pSVar2;
  
  pSVar2 = buffer_tobuf(L);
  uVar1 = lj_lib_checkintrange(L,2,0,0x7fffff00);
  if (uVar1 <= (uint)(*(int *)&pSVar2->e - (int)pSVar2->w)) {
    pSVar2->w = pSVar2->w + uVar1;
    L->top = L->base + 1;
    return 1;
  }
  lj_err_arg(L,2,LJ_ERR_NUMRNG);
}

Assistant:

LJLIB_CF(buffer_method_commit)		LJLIB_REC(.)
{
  SBufExt *sbx = buffer_tobuf(L);
  MSize len = (MSize)lj_lib_checkintrange(L, 2, 0, LJ_MAX_BUF);
  if (len > sbufleft(sbx)) lj_err_arg(L, 2, LJ_ERR_NUMRNG);
  sbx->w += len;
  L->top = L->base+1;  /* Chain buffer object. */
  return 1;
}